

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall ON_Font::IsEngravingFont(ON_Font *this)

{
  ON_wString *this_00;
  bool bVar1;
  Type TVar2;
  long lVar3;
  wchar_t *dirty_name;
  void *pvVar4;
  ON_wString *rhs;
  ulong uVar5;
  int iVar6;
  int j;
  int iVar7;
  ulong uVar8;
  InternalHashToName *key_00;
  undefined1 local_f8 [32];
  undefined1 local_d8 [24];
  ON_wString OStack_c0;
  InternalHashToName key [4];
  
  FamilyName((ON_Font *)local_f8);
  FamilyName((ON_Font *)(local_f8 + 8),(NameLocale)this);
  PostScriptName((ON_Font *)(local_f8 + 0x10));
  PostScriptName((ON_Font *)(local_f8 + 0x18),(NameLocale)this);
  lVar3 = 0;
  do {
    *(undefined4 *)(key[0].m_dirty_name_hash.m_digest + lVar3 + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    *(undefined8 *)(key[0].m_dirty_name_hash.m_digest + lVar3) =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)(key[0].m_dirty_name_hash.m_digest + lVar3 + 8) =
         ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)((long)(&key[0].m_dirty_name_hash + 1) + lVar3 + 4) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x80);
  iVar6 = 0;
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    this_00 = (ON_wString *)(local_f8 + uVar5 * 8);
    bVar1 = ON_wString::IsEmpty(this_00);
    if (!bVar1) {
      bVar1 = ON_wString::IsEmpty(this_00);
      rhs = (ON_wString *)local_f8;
      for (uVar8 = 0; (bVar1 == false && (uVar8 < uVar5)); uVar8 = uVar8 + 1) {
        bVar1 = ::operator==(this_00,rhs);
        rhs = rhs + 1;
      }
      if (bVar1 == false) {
        dirty_name = ON_wString::operator_cast_to_wchar_t_(this_00);
        InternalHashToName::InternalHashToName
                  ((InternalHashToName *)local_d8,dirty_name,(wchar_t *)0x0);
        key_00 = key + iVar6;
        *(undefined8 *)(key[iVar6].m_dirty_name_hash.m_digest + 0x10) = local_d8._16_8_;
        key[iVar6].m_family_name = OStack_c0.m_s;
        *(undefined4 *)(key_00->m_dirty_name_hash).m_digest = local_d8._0_4_;
        *(undefined4 *)(key[iVar6].m_dirty_name_hash.m_digest + 4) = local_d8._4_4_;
        *(undefined4 *)(key[iVar6].m_dirty_name_hash.m_digest + 8) = local_d8._8_4_;
        *(undefined4 *)(key[iVar6].m_dirty_name_hash.m_digest + 0xc) = local_d8._12_4_;
        bVar1 = false;
        for (iVar7 = 0; (bVar1 == false && (iVar7 < iVar6)); iVar7 = iVar7 + 1) {
          bVar1 = ::operator==(&key_00->m_dirty_name_hash,&key[uVar5].m_dirty_name_hash);
        }
        if (bVar1 == false) {
          if (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map == '\0') {
            iVar7 = __cxa_guard_acquire(&Internal_IsEngravingFont(InternalHashToName_const*)::
                                         double_line_name_map);
            if (iVar7 != 0) {
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map,
                         L"OrachTech2Lotf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x20),L"OrachTech2Lotf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x40),L"OrachTechDemo2Lotf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x60),L"OrachTechDemo2Lotf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x80),L"OrachTech2Lttf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xa0),L"OrachTech2Lttf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xc0),L"OrachTechDemo2Lttf");
              InternalHashToName::InternalHashToName
                        ((InternalHashToName *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xe0),L"OrachTechDemo2Lttf");
              __cxa_guard_release(&Internal_IsEngravingFont(InternalHashToName_const*)::
                                   double_line_name_map);
            }
          }
          if (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count == 0)
          {
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count =
                 InternalHashToName::SortAndCullByHash
                           ((InternalHashToName *)
                            Internal_IsEngravingFont(InternalHashToName_const*)::
                            double_line_name_map,8);
          }
          pvVar4 = bsearch(key_00,Internal_IsEngravingFont(InternalHashToName_const*)::
                                  double_line_name_map,
                           Internal_IsEngravingFont(InternalHashToName_const*)::
                           double_line_name_map_count,0x20,InternalHashToName::CompareHash);
          if (pvVar4 != (void *)0x0) break;
          TVar2 = Internal_FigureTypeFromHashedFontName(key_00);
          if ((TVar2 & (Perimeter|SingleStroke)) == SingleStroke) break;
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  lVar3 = 0x18;
  do {
    ON_wString::~ON_wString((ON_wString *)(local_f8 + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return uVar5 < 4;
}

Assistant:

bool ON_Font::IsEngravingFont() const
{
  const ON_wString names[] =
  {
    FamilyName(),
    FamilyName(ON_Font::NameLocale::English),
    PostScriptName(),
    PostScriptName(ON_Font::NameLocale::English)
  };
  
  InternalHashToName key[sizeof(names)/sizeof(names[0])];

  const int name_count = (int)(sizeof(names) / sizeof(names[0]));
  int key_count = 0;
  for (int i = 0; i < name_count; i++)
  {
    const ON_wString& name = names[i];
    if (name.IsEmpty())
      continue;

    // computing the hash is much more expensive than checking for duplicate names (which is common)
    bool bSkipName = name.IsEmpty();
    for (int j = 0; false == bSkipName && j < i; j++)
      bSkipName = (name == names[j]);
    if (bSkipName)
      continue;

    // compute name hash
    key[key_count] = InternalHashToName(name, nullptr);

    // searching for a duplicate hash is more expensive than checking for duplicate hash 
    // (which is common because of space and hyphen differences between family and postscript names)
    for (int j = 0; false == bSkipName && j < key_count; j++)
      bSkipName = (key[key_count].m_dirty_name_hash == key[i].m_dirty_name_hash);
    if (bSkipName)
      continue;

    // search for matching name hash is lists of known single stroke and double stroke fonts
    bool bIsEngravingFont = Internal_IsEngravingFont(&key[key_count]);
    key_count++;
    if (bIsEngravingFont)
      return true;
  }
  return false;
}